

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::SetToken
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aSignedToken)

{
  ErrorCode EVar1;
  ErrorCode local_58 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x35])(local_58);
  __return_storage_ptr__->mCode = local_58[0];
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (EVar1 == kNone) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->mSignedToken,aSignedToken);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetToken(const ByteArray &aSignedToken)
{
    Error error;

    SuccessOrExit(error = mCommissioner->SetToken(aSignedToken));

    mSignedToken = aSignedToken;

exit:
    return error;
}